

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::do_pause(torrent *this,bool was_paused)

{
  peer_connection *ppVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  session_settings *this_00;
  alert_manager *paVar6;
  undefined4 extraout_var;
  vector<peer_connection_*> *this_01;
  reference pppVar7;
  error_code local_128;
  peer_connection *local_118;
  peer_connection *p;
  iterator __end3;
  iterator __begin3;
  vector<peer_connection_*> *__range3;
  undefined1 local_e8 [16];
  enable_shared_from_this<libtorrent::aux::torrent> local_d8;
  function<void_()> local_c8;
  uint local_a4;
  error_code local_a0 [2];
  undefined1 local_80 [28];
  duration<int,_std::ratio<1L,_1L>_> local_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  duration<int,_std::ratio<1L,_1L>_> local_54;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  duration<int,_std::ratio<1L,_1L>_> local_44;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  time_point now;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  bool was_paused_local;
  torrent *this_local;
  
  bVar2 = is_paused(this);
  if (bVar2) {
    if ((*(uint *)&this->field_0x5d8 >> 0x1a & 1) != 0) {
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::cancel(&this->m_inactivity_timer);
    }
    __end2 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
             ::begin(&this->m_extensions);
    ext = (shared_ptr<libtorrent::torrent_plugin> *)
          ::std::__cxx11::
          list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
          ::end(&this->m_extensions);
    while (bVar2 = ::std::operator!=(&__end2,(_Self *)&ext), bVar2) {
      now.__d.__r = (duration)
                    ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*
                              (&__end2);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)now.__d.__r);
      uVar4 = (*peVar5->_vptr_torrent_plugin[6])();
      if ((uVar4 & 1) != 0) {
        return;
      }
      ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
    }
    this_00 = settings(this);
    iVar3 = session_settings::get_int(this_00,0x4062);
    this->m_connect_boost_counter = (uint8_t)iVar3;
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xffffffbf;
    update_state_list(this);
    update_want_tick(this);
    if (!was_paused) {
      local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)time_now();
      local_50.__r = (rep)::std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&local_40,&this->m_started);
      local_44.__r = (rep_conflict)
                     ::std::chrono::
                     duration_cast<std::chrono::duration<int,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                               (&local_50);
      ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::operator+=(&this->m_active_time,&local_44);
      bVar2 = is_seed(this);
      if (bVar2) {
        local_60._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ::std::chrono::operator-
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&local_40,&this->m_became_seed);
        local_54.__r = (rep_conflict)
                       ::std::chrono::
                       duration_cast<std::chrono::duration<int,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)&local_60);
        ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::operator+=
                  (&this->m_seeding_time,&local_54);
      }
      bVar2 = is_finished(this);
      if (bVar2) {
        local_80._16_8_ =
             ::std::chrono::operator-
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&local_40,&this->m_became_finished);
        local_64.__r = (rep_conflict)
                       ::std::chrono::
                       duration_cast<std::chrono::duration<int,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)(local_80 + 0x10))
        ;
        ::std::chrono::duration<int,_std::ratio<1L,_1L>_>::operator+=
                  (&this->m_finished_time,&local_64);
      }
    }
    *(uint *)&this->field_0x5dd = *(uint *)&this->field_0x5dd & 0xfeffffff;
    this->field_0x5c0 = this->field_0x5c0 & 0xfe;
    this->field_0x5c0 = this->field_0x5c0 & 0xfd;
    state_updated(this);
    update_want_peers(this);
    update_want_scrape(this);
    update_gauge(this);
    update_state_list(this);
    log_to_all_peers(this,"pausing");
    if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) ==
        1) {
      bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                        (&this->m_checking_piece,&this->m_num_checked_pieces);
      if (bVar2) {
        paVar6 = alerts(this);
        bVar2 = alert_manager::should_post<libtorrent::torrent_paused_alert>(paVar6);
        if (bVar2) {
          paVar6 = alerts(this);
          get_handle((torrent *)local_80);
          alert_manager::emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                    (paVar6,(torrent_handle *)local_80);
          torrent_handle::~torrent_handle((torrent_handle *)local_80);
        }
      }
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (local_a0,torrent_paused,(type *)0x0);
      disconnect_all(this,local_a0,bittorrent);
    }
    else {
      if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f & 1) == 0) {
        bVar2 = storage_holder::operator_cast_to_bool(&this->m_storage);
        if (bVar2) {
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[4])();
          local_a4 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
          ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_d8);
          ::std::function<void()>::function<libtorrent::aux::torrent::do_pause(bool)::__0,void>
                    ((function<void()> *)&local_c8,(anon_class_16_1_89917c4a *)&local_d8);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                    ((long *)CONCAT44(extraout_var,iVar3),local_a4,&local_c8);
          ::std::function<void_()>::~function(&local_c8);
          do_pause(bool)::$_0::~__0((__0 *)&local_d8);
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x1f])();
        }
        else {
          paVar6 = alerts(this);
          bVar2 = alert_manager::should_post<libtorrent::torrent_paused_alert>(paVar6);
          if (bVar2) {
            paVar6 = alerts(this);
            get_handle((torrent *)local_e8);
            alert_manager::
            emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                      (paVar6,(torrent_handle *)local_e8);
            torrent_handle::~torrent_handle((torrent_handle *)local_e8);
          }
        }
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&__range3,torrent_paused,(type *)0x0);
        disconnect_all(this,(error_code *)&__range3,bittorrent);
      }
      else {
        this_01 = &(this->super_torrent_hot_members).m_connections;
        __end3 = ::std::
                 vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ::begin(&this_01->
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        );
        p = (peer_connection *)
            ::std::
            vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ::end(&this_01->
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 );
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                           *)&p), bVar2) {
          pppVar7 = __gnu_cxx::
                    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    ::operator*(&__end3);
          local_118 = *pppVar7;
          uVar4 = (*(local_118->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
          if ((uVar4 & 1) == 0) {
            iVar3 = peer_connection::outstanding_bytes(local_118);
            if (iVar3 < 1) {
              peer_connection::peer_log(local_118,info,"CLOSING_CONNECTION","torrent_paused");
              ppVar1 = local_118;
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&local_128,torrent_paused,(type *)0x0);
              (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                        (ppVar1,&local_128,1,0);
            }
            else {
              peer_connection::peer_log(local_118,info,"CHOKING_PEER","torrent graceful paused");
              peer_connection::clear_request_queue(local_118);
              peer_connection::choke_this_peer(local_118);
            }
          }
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
          ::operator++(&__end3);
        }
      }
      stop_announcing(this);
    }
  }
  return;
}

Assistant:

void torrent::do_pause(bool const was_paused)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!is_paused()) return;

		// this torrent may be about to consider itself inactive. If so, we want
		// to prevent it from doing so, since it's being paused unconditionally
		// now. An illustrative example of this is a torrent that completes
		// downloading when active_seeds = 0. It completes, it gets paused and it
		// should not come back to life again.
		if (m_pending_active_change)
		{
			m_inactivity_timer.cancel();
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			if (ext->on_pause()) return;
		}
#endif

		m_connect_boost_counter
			= static_cast<std::uint8_t>(settings().get_int(settings_pack::torrent_connect_boost));
		m_inactive = false;

		update_state_list();
		update_want_tick();

		// do_paused() may be called twice, if the first time is to enter
		// graceful pause, and the second time proper pause. We can only update
		// these timers once, otherwise they'll be inflated
		if (!was_paused)
		{
			const time_point now = aux::time_now();

			m_active_time +=
				duration_cast<seconds32>(now - m_started);

			if (is_seed()) m_seeding_time +=
				duration_cast<seconds32>(now - m_became_seed);

			if (is_finished()) m_finished_time +=
				duration_cast<seconds32>(now - m_became_finished);
		}

		m_announce_to_dht = false;
		m_announce_to_trackers = false;
		m_announce_to_lsd = false;

		state_updated();
		update_want_peers();
		update_want_scrape();
		update_gauge();
		update_state_list();

#ifndef TORRENT_DISABLE_LOGGING
		log_to_all_peers("pausing");
#endif

		// when checking and being paused in graceful pause mode, we
		// post the paused alert when the last outstanding disk job completes
		if (m_state == torrent_status::checking_files)
		{
			if (m_checking_piece == m_num_checked_pieces)
			{
				if (alerts().should_post<torrent_paused_alert>())
					alerts().emplace_alert<torrent_paused_alert>(get_handle());
			}
			disconnect_all(errors::torrent_paused, operation_t::bittorrent);
			return;
		}

		if (!m_graceful_pause_mode)
		{
			// this will make the storage close all
			// files and flush all cached data
			if (m_storage)
			{
				// the torrent_paused alert will be posted from on_torrent_paused
				m_ses.disk_thread().async_stop_torrent(m_storage
					, [self = shared_from_this()] { self->on_torrent_paused(); });
				m_ses.deferred_submit_jobs();
			}
			else
			{
				if (alerts().should_post<torrent_paused_alert>())
					alerts().emplace_alert<torrent_paused_alert>(get_handle());
			}

			disconnect_all(errors::torrent_paused, operation_t::bittorrent);
		}
		else
		{
			// disconnect all peers with no outstanding data to receive
			// and choke all remaining peers to prevent responding to new
			// requests
			for (auto* p : m_connections)
			{
				TORRENT_INCREMENT(m_iterating_connections);
				TORRENT_ASSERT(p->associated_torrent().lock().get() == this);

				if (p->is_disconnecting()) continue;

				if (p->outstanding_bytes() > 0)
				{
#ifndef TORRENT_DISABLE_LOGGING
					p->peer_log(peer_log_alert::info, "CHOKING_PEER", "torrent graceful paused");
#endif
					// remove any un-sent requests from the queue
					p->clear_request_queue();
					// don't accept new requests from the peer
					p->choke_this_peer();
					continue;
				}

				// since we're currently in graceful pause mode, the last peer to
				// disconnect (assuming all peers end up begin disconnected here)
				// will post the torrent_paused_alert
#ifndef TORRENT_DISABLE_LOGGING
				p->peer_log(peer_log_alert::info, "CLOSING_CONNECTION", "torrent_paused");
#endif
				p->disconnect(errors::torrent_paused, operation_t::bittorrent);
			}
		}

		stop_announcing();
	}